

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O2

int __thiscall PPSUnit::deserialize(PPSUnit *this)

{
  BitStreamReader *this_00;
  uint8_t *puVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint8_t *end;
  
  puVar1 = (this->super_NALUnit).m_nalBuffer;
  end = puVar1 + (this->super_NALUnit).m_nalBufferLen;
  iVar3 = NALUnit::deserialize(&this->super_NALUnit,puVar1,end);
  if (iVar3 == 0) {
    puVar1 = (this->super_NALUnit).m_nalBuffer;
    if ((long)end - (long)puVar1 < 2) {
      iVar3 = -10;
    }
    else {
      this_00 = &(this->super_NALUnit).bitReader;
      BitStreamReader::setBuffer(this_00,puVar1 + 1,end);
      uVar4 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
      this->pic_parameter_set_id = uVar4;
      iVar3 = 1;
      if (uVar4 < 0x100) {
        uVar4 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
        this->seq_parameter_set_id = uVar4;
        if (uVar4 < 0x20) {
          bVar2 = BitStreamReader::getBit(this_00);
          this->entropy_coding_mode_flag = (uint)bVar2;
          bVar2 = BitStreamReader::getBit(this_00);
          this->pic_order_present_flag = (uint)bVar2;
          this->m_ready = true;
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int PPSUnit::deserialize()
{
    uint8_t* nalEnd = m_nalBuffer + m_nalBufferLen;
    const int rez = NALUnit::deserialize(m_nalBuffer, nalEnd);
    if (rez != 0)
        return rez;
    if (nalEnd - m_nalBuffer < 2)
        return NOT_ENOUGH_BUFFER;
    try
    {
        bitReader.setBuffer(m_nalBuffer + 1, nalEnd);
        pic_parameter_set_id = extractUEGolombCode();
        if (pic_parameter_set_id >= 256)
            return 1;
        seq_parameter_set_id = extractUEGolombCode();
        if (seq_parameter_set_id >= 32)
            return 1;
        entropy_coding_mode_flag = bitReader.getBit();
        pic_order_present_flag = bitReader.getBit();

        m_ready = true;
        return 0;
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}